

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O0

void history_unmask_unknown(player *p)

{
  _Bool _Var1;
  player_history *ppVar2;
  size_t sVar3;
  size_t local_20;
  size_t i;
  player_history *h;
  player *p_local;
  
  ppVar2 = &p->hist;
  local_20 = (p->hist).next;
  while (sVar3 = local_20 - 1, local_20 != 0) {
    _Var1 = flag_has_dbg(ppVar2->entries[sVar3].type,2,2,"h->entries[i].type",
                         "HIST_ARTIFACT_UNKNOWN");
    local_20 = sVar3;
    if (_Var1) {
      flag_off(ppVar2->entries[sVar3].type,2,2);
      flag_on_dbg(ppVar2->entries[sVar3].type,2,3,"h->entries[i].type","HIST_ARTIFACT_KNOWN");
    }
  }
  return;
}

Assistant:

void history_unmask_unknown(struct player *p)
{
	struct player_history *h = &p->hist;

	size_t i = h->next;
	while (i--) {
		if (hist_has(h->entries[i].type, HIST_ARTIFACT_UNKNOWN)) {
			hist_off(h->entries[i].type, HIST_ARTIFACT_UNKNOWN);
			hist_on(h->entries[i].type, HIST_ARTIFACT_KNOWN);
		}
	}
}